

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedStandaloneMaxNotAllowed_Test
::ParseErrorTest_EnumReservedStandaloneMaxNotAllowed_Test
          (ParseErrorTest_EnumReservedStandaloneMaxNotAllowed_Test *this)

{
  ParseErrorTest_EnumReservedStandaloneMaxNotAllowed_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseErrorTest);
  (this->super_ParseErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseErrorTest_EnumReservedStandaloneMaxNotAllowed_Test_02a0d890;
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedStandaloneMaxNotAllowed) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "  FOO = 1;\n"
      "  reserved max;\n"
      "}\n",
      "2:11: Reserved names must be string literals. (Only editions supports "
      "identifiers.)\n");
}